

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void disassemble_binary(ifstream *in,ostream *out)

{
  File f;
  File local_60;
  
  File::parse_file_binary(&local_60,in);
  File::output_text(&local_60,out);
  std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_60.functions);
  if (local_60.start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.start.
                    super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.start.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.start.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_60.constants);
  return;
}

Assistant:

void disassemble_binary(std::ifstream* in, std::ostream* out) {
    try {
        File f = File::parse_file_binary(*in);
        f.output_text(*out);
    }
    catch (const std::exception& e) {
        println(std::cerr, e.what());
    }
}